

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

void __thiscall QTextBrowserPrivate::highlightLink(QTextBrowserPrivate *this,QString *anchor)

{
  QWidget *this_00;
  undefined1 auVar1 [8];
  int iVar2;
  QObject *pQVar3;
  long in_FS_OFFSET;
  QUrl url;
  QCursor moved;
  undefined1 local_50 [8];
  QCursor local_48;
  QUrl *pQStack_40;
  QWidgetData *local_30;
  
  local_30 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if ((anchor->d).size == 0) {
    QWidget::cursor((QWidget *)&local_48);
    iVar2 = QCursor::shape();
    QCursor::~QCursor(&local_48);
    if (iVar2 != 0xd) {
      QWidget::cursor((QWidget *)local_50);
      auVar1 = local_50;
      local_50 = (undefined1  [8])0x0;
      local_48.d = (this->oldCursor).d;
      (this->oldCursor).d = (QCursorData *)auVar1;
      QCursor::~QCursor(&local_48);
      QCursor::~QCursor((QCursor *)local_50);
    }
    QWidget::setCursor((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport,
                       &this->oldCursor);
    QUrl::QUrl((QUrl *)local_50);
    pQVar3 = *(QObject **)
              &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
               super_QWidgetPrivate.field_0x8;
  }
  else {
    this_00 = (this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport;
    QCursor::QCursor(&local_48,PointingHandCursor);
    QWidget::setCursor(this_00,&local_48);
    QCursor::~QCursor(&local_48);
    local_50 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl((QUrl *)&local_48,(QString *)anchor,TolerantMode);
    (**(code **)(*(long *)&(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.
                           super_QFramePrivate.super_QWidgetPrivate + 0xc0))
              (local_50,this,(QUrl *)&local_48);
    QUrl::~QUrl((QUrl *)&local_48);
    pQVar3 = *(QObject **)
              &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
               super_QWidgetPrivate.field_0x8;
  }
  local_48.d = (QCursorData *)0x0;
  pQStack_40 = (QUrl *)local_50;
  QMetaObject::activate(pQVar3,&QTextBrowser::staticMetaObject,4,&local_48.d);
  QUrl::~QUrl((QUrl *)local_50);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::highlightLink(const QString &anchor)
{
    if (anchor.isEmpty()) {
#ifndef QT_NO_CURSOR
        if (viewport->cursor().shape() != Qt::PointingHandCursor)
            oldCursor = viewport->cursor();
        viewport->setCursor(oldCursor);
#endif
        emitHighlighted(QUrl());
    } else {
#ifndef QT_NO_CURSOR
        viewport->setCursor(Qt::PointingHandCursor);
#endif

        const QUrl url = resolveUrl(anchor);
        emitHighlighted(url);
    }
}